

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsNonNumericRegOpnd
          (GlobOpt *this,RegOpnd *opnd,bool inGlobOpt,bool *isSafeToTransferInPrepass)

{
  bool bVar1;
  BOOLEAN BVar2;
  Value *this_00;
  ValueInfo *local_68;
  bool local_59;
  bool isSafeToTransfer;
  ValueInfo *opndValueInfo;
  Value *opndValue;
  bool *local_30;
  bool *isSafeToTransferInPrepass_local;
  RegOpnd *pRStack_20;
  bool inGlobOpt_local;
  RegOpnd *opnd_local;
  GlobOpt *this_local;
  
  if (opnd == (RegOpnd *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((*(uint *)&opnd->m_sym->field_0x18 >> 1 & 1) == 0) {
    if (inGlobOpt) {
      local_30 = isSafeToTransferInPrepass;
      isSafeToTransferInPrepass_local._7_1_ = inGlobOpt;
      pRStack_20 = opnd;
      opnd_local = (RegOpnd *)this;
      opndValue._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&opnd->super_Opnd);
      bVar1 = ValueType::IsNumber((ValueType *)((long)&opndValue + 6));
      local_59 = true;
      if (!bVar1) {
        local_59 = GlobOptBlockData::IsTypeSpecialized
                             (&this->currentBlock->globOptData,&pRStack_20->m_sym->super_Sym);
      }
      if (local_59 == false) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = IsLoopPrePass(this);
        if (bVar1) {
          this_00 = GlobOptBlockData::FindValue
                              (&this->currentBlock->globOptData,&pRStack_20->m_sym->super_Sym);
          if (this_00 == (Value *)0x0) {
            local_68 = (ValueInfo *)0x0;
          }
          else {
            local_68 = ::Value::GetValueInfo(this_00);
          }
          if (local_68 == (ValueInfo *)0x0) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = IsSafeToTransferInPrepass(this,pRStack_20->m_sym,local_68);
            if (local_30 != (bool *)0x0) {
              *local_30 = bVar1;
            }
            BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                              (this->prePassLoop->preservesNumberValue,
                               (pRStack_20->m_sym->super_Sym).m_id);
            if (BVar2 == '\0') {
              this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::IsNonNumericRegOpnd(IR::RegOpnd* opnd, bool inGlobOpt, bool* isSafeToTransferInPrepass /*=nullptr*/) const
{
    if (opnd == nullptr)
    {
        return false;
    }

    if (opnd->m_sym->m_isNotNumber)
    {
        return true;
    }

    if (!inGlobOpt)
    {
        return false;
    }

    if (opnd->GetValueType().IsNumber() || currentBlock->globOptData.IsTypeSpecialized(opnd->m_sym))
    {
        if (!this->IsLoopPrePass())
        {
            return false;
        }

        Value * opndValue = this->currentBlock->globOptData.FindValue(opnd->m_sym);
        ValueInfo * opndValueInfo = opndValue ? opndValue->GetValueInfo() : nullptr;
        if (!opndValueInfo)
        {
            return true;
        }

        bool isSafeToTransfer = this->IsSafeToTransferInPrepass(opnd->m_sym, opndValueInfo);
        if (isSafeToTransferInPrepass != nullptr)
        {
            *isSafeToTransferInPrepass = isSafeToTransfer;
        }
        if (this->prePassLoop->preservesNumberValue->Test(opnd->m_sym->m_id))
        {
            return false;
        }

        return !isSafeToTransfer;
    }

    return true;
}